

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,double *x,int numx,double *y)

{
  undefined8 *puVar1;
  int iVar2;
  SimpleConstructData *pSVar3;
  _Fwd_list_node_base _Var4;
  _Fwd_list_node_base _Var5;
  _Fwd_list_node_base _Var6;
  ulong uVar7;
  _Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> _Var8;
  long lVar9;
  ulong uVar10;
  pointer __n;
  Data2D<int> combined_pnts;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  pnts;
  undefined1 local_d8 [24];
  _Fwd_list_node_base local_c0;
  _Fwd_list_node_base _Stack_b8;
  _Fwd_list_node_base local_b0;
  int local_a4;
  pointer local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  MultiIndexSet local_80;
  MultiIndexSet local_58;
  
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  __n = (pointer)(long)numx;
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_98,(size_type)__n,(allocator_type *)local_d8);
  uVar7 = (ulong)(uint)numx;
  local_a4 = numx;
  local_a0 = __n;
  if (0 < numx) {
    lVar9 = 0;
    do {
      getMultiIndex<(TasGrid::RuleLocal::erule)3>
                ((vector<int,_std::allocator<int>_> *)local_d8,this,x);
      ::std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&((local_98.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar9),
                 (vector<int,_std::allocator<int>_> *)local_d8);
      if ((pointer)local_d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
      }
      lVar9 = lVar9 + 0x18;
      x = x + iVar2;
    } while (uVar7 * 0x18 != lVar9);
  }
  iVar2 = local_a4;
  pSVar3 = (this->dynamic_values)._M_t.
           super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
           .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
  if (*(pointer *)
       &(pSVar3->initial_points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl !=
      *(pointer *)((long)&(pSVar3->initial_points).indexes + 8)) {
    local_d8._0_8_ = SEXT48((this->super_BaseCanonicalGrid).num_dimensions);
    local_d8._8_8_ = local_a0;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(local_d8 + 0x10),
               local_d8._0_8_ * (long)local_a0,(allocator_type *)&local_80);
    if (0 < iVar2) {
      uVar10 = 0;
      do {
        lVar9 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
        if (0 < lVar9) {
          memmove((pointer)(local_d8._16_8_ + local_d8._0_8_ * uVar10 * 4),
                  local_98.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start,lVar9 << 2);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar7);
    }
    pSVar3 = (this->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
             .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
    MultiIndexSet::MultiIndexSet(&local_58,(Data2D<int> *)local_d8);
    MultiIndexSet::operator-(&local_80,&pSVar3->initial_points,&local_58);
    pSVar3 = (this->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
             .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
    (pSVar3->initial_points).cache_num_indexes = local_80.cache_num_indexes;
    (pSVar3->initial_points).num_dimensions = local_80.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(pSVar3->initial_points).indexes,&local_80.indexes);
    if (local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_d8._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_d8._16_8_,(long)_Stack_b8._M_next - local_d8._16_8_);
    }
  }
  if (0 < iVar2) {
    iVar2 = (this->super_BaseCanonicalGrid).num_outputs;
    lVar9 = 0;
    _Var4._M_next = local_c0._M_next;
    _Var5._M_next = _Stack_b8._M_next;
    _Var6._M_next = local_b0._M_next;
    do {
      local_b0._M_next = _Var6._M_next;
      _Stack_b8._M_next = _Var5._M_next;
      local_c0._M_next = _Var4._M_next;
      pSVar3 = (this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
      local_d8._0_8_ =
           *(undefined8 *)
            ((long)&((local_98.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start + lVar9);
      local_d8._8_8_ =
           *(undefined8 *)
            ((long)&((local_98.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_finish + lVar9);
      local_d8._16_8_ =
           *(undefined8 *)
            ((long)&((local_98.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_end_of_storage + lVar9);
      puVar1 = (undefined8 *)
               ((long)&((local_98.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)&((local_98.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_end_of_storage + lVar9) = 0;
      ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)&local_c0,y,
                 y + (this->super_BaseCanonicalGrid).num_outputs,(allocator_type *)&local_80);
      _Var8._M_impl._M_head._M_next = (_Fwd_list_impl)operator_new(0x38);
      *(_Fwd_list_node_base *)_Var8._M_impl._M_head._M_next = (_Fwd_list_node_base)0x0;
      (((_Fwd_list_impl *)((long)_Var8._M_impl._M_head._M_next + 8))->_M_head)._M_next =
           (_Fwd_list_node_base *)local_d8._0_8_;
      (((_Fwd_list_impl *)((long)_Var8._M_impl._M_head._M_next + 0x10))->_M_head)._M_next =
           (_Fwd_list_node_base *)local_d8._8_8_;
      (((_Fwd_list_impl *)((long)_Var8._M_impl._M_head._M_next + 0x18))->_M_head)._M_next =
           (_Fwd_list_node_base *)local_d8._16_8_;
      (((_Fwd_list_impl *)((long)_Var8._M_impl._M_head._M_next + 0x20))->_M_head)._M_next =
           local_c0._M_next;
      (((_Fwd_list_impl *)((long)_Var8._M_impl._M_head._M_next + 0x28))->_M_head)._M_next =
           _Stack_b8._M_next;
      (((_Fwd_list_impl *)((long)_Var8._M_impl._M_head._M_next + 0x30))->_M_head)._M_next =
           local_b0._M_next;
      local_b0._M_next = (_Fwd_list_node_base *)0x0;
      _Var6._M_next = local_b0._M_next;
      local_c0._M_next = (_Fwd_list_node_base *)0x0;
      _Var4._M_next = local_c0._M_next;
      _Stack_b8._M_next = (_Fwd_list_node_base *)0x0;
      _Var5._M_next = _Stack_b8._M_next;
      *(_Fwd_list_node_base **)_Var8._M_impl._M_head._M_next =
           (_Fwd_list_node_base *)
           (pSVar3->data).
           super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>._M_impl.
           _M_head;
      (pSVar3->data).super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>.
      _M_impl = _Var8._M_impl._M_head._M_next;
      local_b0._M_next = (_Fwd_list_node_base *)0x0;
      _Stack_b8._M_next = (_Fwd_list_node_base *)0x0;
      local_c0._M_next = (_Fwd_list_node_base *)0x0;
      local_d8._16_8_ = (pointer)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_d8._0_8_ = (pointer)0x0;
      lVar9 = lVar9 + 0x18;
      y = y + iVar2;
    } while (uVar7 * 0x18 != lVar9);
  }
  loadConstructedPoints<(TasGrid::RuleLocal::erule)3>(this);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void GridLocalPolynomial::loadConstructedPoint(const double x[], int numx, const double y[]){
    Utils::Wrapper2D<const double> wrapx(num_dimensions, x);
    std::vector<std::vector<int>> pnts(numx);
    #pragma omp parallel for
    for(int i=0; i<numx; i++)
        pnts[i] = getMultiIndex<effrule>(wrapx.getStrip(i));

    if (!dynamic_values->initial_points.empty()){
        Data2D<int> combined_pnts(num_dimensions, numx);
        for(int i=0; i<numx; i++)
            std::copy_n(pnts[i].begin(), num_dimensions, combined_pnts.getIStrip(i));
        dynamic_values->initial_points = dynamic_values->initial_points - combined_pnts;
    }

    Utils::Wrapper2D<const double> wrapy(num_outputs, y);
    for(int i=0; i<numx; i++)
        dynamic_values->data.push_front({std::move(pnts[i]), std::vector<double>(wrapy.getStrip(i), wrapy.getStrip(i) + num_outputs)});

    loadConstructedPoints<effrule>();
}